

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

int slurpfile(char *filename,char *buffer,int buflen)

{
  int __fd;
  ssize_t sVar1;
  int in_EDX;
  void *in_RSI;
  char *in_RDI;
  int read_len;
  int fd;
  int local_1c;
  
  __fd = open(in_RDI,0);
  if (__fd < 0) {
    printf("open() error on file %s \n",in_RDI);
    exit(0);
  }
  sVar1 = read(__fd,in_RSI,(long)in_EDX);
  local_1c = (int)sVar1;
  if (local_1c < 1) {
    printf("read() error on file %s \n",in_RDI);
    exit(0);
  }
  if (local_1c == in_EDX) {
    local_1c = local_1c + -1;
    printf("slurpfile() read() buffer overflow on file %s",in_RDI);
  }
  *(undefined1 *)((long)in_RSI + (long)local_1c) = 0;
  close(__fd);
  return local_1c;
}

Assistant:

int slurpfile(const char *filename, char *buffer, int buflen)
{
#ifndef _MSC_VER
    int fd, read_len;
    fd = open(filename, O_RDONLY);
    if(fd < 0) {
	printf("open() error on file %s \n", filename); 
	exit(0);
    }
    read_len = read(fd, buffer, buflen);
    if(read_len <= 0) {
	printf("read() error on file %s \n", filename); 
	exit(0);
    }
    if (read_len == buflen) {
	--read_len;
	printf("slurpfile() read() buffer overflow on file %s", filename);
    }
    buffer[read_len] = '\0';
    close(fd);
    return read_len;
#else
    return 0;
#endif
}